

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O2

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ssize_t avail_in;
  uchar props [5];
  lzma_filter filters [2];
  ssize_t local_38;
  
  puVar1 = (undefined8 *)self->data;
  do {
    lVar10 = puVar1[0x12];
    puVar1[3] = puVar1[0x11];
    puVar1[4] = lVar10;
    lVar2 = puVar1[0x15];
    lVar7 = lVar2;
    while ((lVar10 != 0 && (*(char *)(puVar1 + 0x14) == '\0'))) {
      if (*(char *)((long)puVar1 + 0xa1) == '\0') {
        pvVar6 = self->data;
        pvVar5 = __archive_read_filter_ahead(self->upstream,6,&local_38);
        if (pvVar5 == (void *)0x0) {
          return -0x1e;
        }
        *(undefined1 *)((long)pvVar6 + 0xa2) = *(undefined1 *)((long)pvVar5 + 4);
        props[0] = ']';
        uVar8 = *(byte *)((long)pvVar5 + 5) & 0x1f;
        if (uVar8 - 0x1e < 0xffffffee) {
          return -0x1e;
        }
        uVar9 = 1 << (sbyte)uVar8;
        iVar3 = (uint)(*(byte *)((long)pvVar5 + 5) >> 5) * (uVar9 >> 4);
        if (uVar8 < 0xd) {
          iVar3 = 0;
        }
        props._1_4_ = uVar9 - iVar3;
        __archive_read_filter_consume(self->upstream,6);
        *(undefined8 *)((long)pvVar6 + 0xa8) = 6;
        filters[0].id = 0x4000000000000001;
        filters[0].options = (void *)0x0;
        filters[1].id = 0xffffffffffffffff;
        filters[1].options = (void *)0x0;
        iVar3 = lzma_properties_decode(filters,0,props,5);
        if (iVar3 != 0) goto LAB_00228b76;
        iVar3 = lzma_raw_decoder(pvVar6,filters);
        free(filters[0].options);
        if (iVar3 != 0) goto LAB_00228b76;
        *(undefined1 *)((long)puVar1 + 0xa1) = 1;
      }
      pvVar6 = __archive_read_filter_ahead(self->upstream,1,&avail_in);
      *puVar1 = pvVar6;
      if (avail_in < 0 && pvVar6 == (void *)0x0) {
        archive_set_error(&self->archive->archive,-1,"truncated input");
        return -0x1e;
      }
      puVar1[1] = avail_in;
      iVar3 = lzma_code(puVar1,(avail_in == 0) * '\x03');
      if (iVar3 != 0) {
        if (iVar3 != 1) {
LAB_00228b76:
          set_error(self,iVar3);
          return -0x1e;
        }
        *(undefined1 *)(puVar1 + 0x14) = 1;
      }
      __archive_read_filter_consume(self->upstream,avail_in - puVar1[1]);
      lVar7 = (avail_in - puVar1[1]) + puVar1[0x15];
      puVar1[0x15] = lVar7;
      lVar10 = puVar1[4];
    }
    lVar10 = puVar1[3] - (long)puVar1[0x11];
    puVar1[0x13] = puVar1[0x13] + lVar10;
    puVar1[0x16] = puVar1[0x16] + lVar10;
    if (lVar10 != 0) {
      *p = (void *)puVar1[0x11];
      if (self->code != 9) {
        return lVar10;
      }
      uVar4 = lzma_crc32(puVar1[0x11],lVar10,*(undefined4 *)((long)puVar1 + 0xa4));
      *(undefined4 *)((long)puVar1 + 0xa4) = uVar4;
      if (*(char *)(puVar1 + 0x14) != '\0') {
        iVar3 = lzip_tail(self);
        if (iVar3 != 0) {
          return (long)iVar3;
        }
        return lVar10;
      }
      return lVar10;
    }
    if (((lVar2 == lVar7) || (self->code != 9)) || (*(char *)(puVar1 + 0x14) == '\0')) break;
    iVar3 = lzip_tail(self);
    if (iVar3 != 0) {
      return (long)iVar3;
    }
  } while (*(char *)(puVar1 + 0x14) == '\0');
  *p = (void *)0x0;
  return 0;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int64_t member_in;
	int ret;

	state = (struct private_data *)self->data;

	redo:
	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;
	member_in = state->member_in;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0) {
		if (member_in != state->member_in &&
		    self->code == ARCHIVE_FILTER_LZIP &&
		    state->eof) {
			ret = lzip_tail(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			if (!state->eof)
				goto redo;
		}
		*p = NULL;
	} else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}